

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O3

void __thiscall cmComputeTargetDepends::ComputeIntermediateGraph(cmComputeTargetDepends *this)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  uint uVar2;
  TargetType TVar3;
  cmValue cVar4;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar5;
  ulong uVar6;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *this_01;
  long lVar7;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *__x;
  string_view value;
  string local_50;
  
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::resize
            (&(this->IntermediateGraph).
              super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,0);
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::resize
            (&(this->IntermediateGraph).
              super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
             ((long)(this->InitialGraph).
                    super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                    super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->InitialGraph).
                    super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                    super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  uVar2 = (int)((long)(this->InitialGraph).
                      super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                      super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->InitialGraph).
                      super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                      super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x55555555;
  if (0 < (int)uVar2) {
    lVar7 = 0;
    uVar6 = 0;
    do {
      __x = (vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *)
            ((long)&(((this->InitialGraph).
                      super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                      super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                      super__Vector_impl_data._M_start)->
                    super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
                    super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + lVar7);
      this_01 = (vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *)
                ((long)&(((this->IntermediateGraph).
                          super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                          super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                          _M_impl.super__Vector_impl_data._M_start)->
                        super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
                        super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + lVar7);
      this_00 = (this->Targets).
                super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar6];
      TVar3 = cmGeneratorTarget::GetType(this_00);
      if ((TVar3 == STATIC_LIBRARY) ||
         (TVar3 = cmGeneratorTarget::GetType(this_00), TVar3 == OBJECT_LIBRARY)) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"OPTIMIZE_DEPENDENCIES","");
        cVar4 = cmGeneratorTarget::GetProperty(this_00,&local_50);
        pcVar5 = extraout_RDX;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          pcVar5 = extraout_RDX_00;
        }
        if ((cVar4.Value == (string *)0x0) ||
           (value._M_str = pcVar5, value._M_len = (size_t)((cVar4.Value)->_M_dataplus)._M_p,
           bVar1 = cmValue::IsOn((cmValue *)(cVar4.Value)->_M_string_length,value), !bVar1)) {
          std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::operator=(this_01,__x);
        }
        else {
          OptimizeLinkDependencies(this,this_00,(cmGraphEdgeList *)this_01,(cmGraphEdgeList *)__x);
        }
      }
      else {
        std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::operator=(this_01,__x);
      }
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 0x18;
    } while ((uVar2 & 0x7fffffff) != uVar6);
  }
  return;
}

Assistant:

void cmComputeTargetDepends::ComputeIntermediateGraph()
{
  this->IntermediateGraph.resize(0);
  this->IntermediateGraph.resize(this->InitialGraph.size());

  int n = static_cast<int>(this->InitialGraph.size());
  for (int i = 0; i < n; ++i) {
    auto const& initialEdges = this->InitialGraph[i];
    auto& intermediateEdges = this->IntermediateGraph[i];
    cmGeneratorTarget const* gt = this->Targets[i];
    if (gt->GetType() != cmStateEnums::STATIC_LIBRARY &&
        gt->GetType() != cmStateEnums::OBJECT_LIBRARY) {
      intermediateEdges = initialEdges;
    } else {
      if (cmValue optimizeDependencies =
            gt->GetProperty("OPTIMIZE_DEPENDENCIES")) {
        if (cmIsOn(optimizeDependencies)) {
          this->OptimizeLinkDependencies(gt, intermediateEdges, initialEdges);
        } else {
          intermediateEdges = initialEdges;
        }
      } else {
        intermediateEdges = initialEdges;
      }
    }
  }
}